

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::watch(DirWatcherGeneric *this,bool reportOwnChange)

{
  DirectorySnapshot *this_00;
  WatchID WVar1;
  FileWatchListener *pFVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  undefined7 in_register_00000031;
  pointer pFVar5;
  pointer ppVar6;
  allocator local_2f9;
  string local_2f8;
  string local_2d8 [32];
  string local_2b8;
  string local_298;
  string local_278;
  DirectorySnapshotDiff Diff;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->DirSnap;
  DirectorySnapshot::scan(&Diff,this_00);
  if ((((int)CONCAT71(in_register_00000031,reportOwnChange) != 0) && (Diff.DirChanged == true)) &&
     (this->Parent != (DirWatcherGeneric *)0x0)) {
    WVar1 = (this->Watch->super_Watcher).ID;
    pFVar2 = (this->Watch->super_Watcher).Listener;
    std::__cxx11::string::string((string *)&local_278,(string *)this_00);
    FileSystem::pathRemoveFileName(&local_2f8,&local_278);
    std::__cxx11::string::string((string *)&local_2b8,(string *)this_00);
    FileSystem::fileNameFromPath(&local_298,&local_2b8);
    std::__cxx11::string::string(local_2d8,"",&local_2f9);
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&local_2f8,&local_298,3,local_2d8);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_278);
  }
  bVar3 = DirectorySnapshotDiff::changed(&Diff);
  if (bVar3) {
    for (pFVar5 = Diff.FilesCreated.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.FilesCreated.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_2f8);
      handleAction(this,&pFVar5->Filepath,1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (pFVar5 = Diff.FilesModified.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.FilesModified.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_2f8);
      handleAction(this,&pFVar5->Filepath,3,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    for (pFVar5 = Diff.FilesDeleted.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.FilesDeleted.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_2f8);
      handleAction(this,&pFVar5->Filepath,2,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    for (ppVar6 = Diff.FilesMoved.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar6 != Diff.FilesMoved.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      std::__cxx11::string::string((string *)&local_b0,(string *)ppVar6);
      handleAction(this,&(ppVar6->second).Filepath,4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    for (pFVar5 = Diff.DirsCreated.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.DirsCreated.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_d0,(string *)pFVar5);
      createDirectory(this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    for (pFVar5 = Diff.DirsModified.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.DirsModified.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_2f8);
      handleAction(this,&pFVar5->Filepath,3,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    for (pFVar5 = Diff.DirsDeleted.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar5 != Diff.DirsDeleted.
                  super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      std::__cxx11::string::string((string *)&local_110,"",(allocator *)&local_2f8);
      handleAction(this,&pFVar5->Filepath,2,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string((string *)&local_130,(string *)pFVar5);
      removeDirectory(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    for (ppVar6 = Diff.DirsMoved.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar6 != Diff.DirsMoved.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      std::__cxx11::string::string((string *)&local_150,(string *)ppVar6);
      handleAction(this,&(ppVar6->second).Filepath,4,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::string((string *)&local_170,(string *)ppVar6);
      std::__cxx11::string::string((string *)&local_190,(string *)&ppVar6->second);
      moveDirectory(this,&local_170,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  for (p_Var4 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    watch(*(DirWatcherGeneric **)(p_Var4 + 2),false);
  }
  DirectorySnapshotDiff::~DirectorySnapshotDiff(&Diff);
  return;
}

Assistant:

void DirWatcherGeneric::watch( bool reportOwnChange ) {
	DirectorySnapshotDiff Diff = DirSnap.scan();

	if ( reportOwnChange && Diff.DirChanged && NULL != Parent ) {
		Watch->Listener->handleFileAction(
			Watch->ID, FileSystem::pathRemoveFileName( DirSnap.DirectoryInfo.Filepath ),
			FileSystem::fileNameFromPath( DirSnap.DirectoryInfo.Filepath ), Actions::Modified );
	}

	if ( Diff.changed() ) {
		FileInfoList::iterator it;
		MovedList::iterator mit;

		/// Files
		DiffIterator( FilesCreated ) {
			handleAction( ( *it ).Filepath, Actions::Add );
		}

		DiffIterator( FilesModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( FilesDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
		}

		DiffMovedIterator( FilesMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
		}

		/// Directories
		DiffIterator( DirsCreated ) {
			createDirectory( ( *it ).Filepath );
		}

		DiffIterator( DirsModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( DirsDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
			removeDirectory( ( *it ).Filepath );
		}

		DiffMovedIterator( DirsMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
			moveDirectory( ( *mit ).first, ( *mit ).second.Filepath );
		}
	}

	/// Process the subdirectories looking for changes
	for ( DirWatchMap::iterator dit = Directories.begin(); dit != Directories.end(); ++dit ) {
		/// Just watch
		dit->second->watch();
	}
}